

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_inter_pred_luma_copy_w16out_sse42
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  int iVar1;
  WORD16 *pWVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar7 [16];
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0x78,
                  "void ihevc_inter_pred_luma_copy_w16out_sse42(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((ht & 3U) != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_sse42_intr.c"
                  ,0x79,
                  "void ihevc_inter_pred_luma_copy_w16out_sse42(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((wd & 4U) == 0) {
    if (0 < ht) {
      iVar1 = 0;
      do {
        if (0 < wd) {
          lVar3 = 0;
          pWVar2 = pi2_dst;
          do {
            auVar4 = pmovzxbw(in_XMM0,*(undefined8 *)(pu1_src + lVar3));
            auVar5 = pmovzxbw(in_XMM1,*(undefined8 *)(pu1_src + lVar3 + src_strd));
            auVar6 = pmovzxbw(in_XMM2,*(undefined8 *)(pu1_src + lVar3 + src_strd * 2));
            auVar7 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_src + lVar3 + src_strd * 3));
            in_XMM0 = psllw(auVar4,6);
            in_XMM1 = psllw(auVar5,6);
            in_XMM2 = psllw(auVar6,6);
            in_XMM3 = psllw(auVar7,6);
            *(undefined1 (*) [16])(pi2_dst + lVar3) = in_XMM0;
            *(undefined1 (*) [16])(pi2_dst + dst_strd + lVar3) = in_XMM1;
            *(undefined1 (*) [16])(pi2_dst + dst_strd * 2 + lVar3) = in_XMM2;
            *(undefined1 (*) [16])(pi2_dst + dst_strd * 3 + lVar3) = in_XMM3;
            pWVar2 = pWVar2 + 8;
            lVar3 = lVar3 + 8;
          } while ((int)lVar3 < wd);
          pu1_src = pu1_src + lVar3;
          pi2_dst = pWVar2;
        }
        pu1_src = pu1_src + (src_strd * 4 - wd);
        pi2_dst = pi2_dst + (dst_strd * 4 - wd);
        iVar1 = iVar1 + 4;
      } while (iVar1 < ht);
    }
  }
  else if (0 < ht) {
    iVar1 = 0;
    do {
      if (0 < wd) {
        lVar3 = 0;
        pWVar2 = pi2_dst;
        do {
          auVar4 = pmovzxbw(in_XMM0,*(undefined8 *)(pu1_src + lVar3));
          auVar5 = pmovzxbw(in_XMM1,*(undefined8 *)(pu1_src + lVar3 + src_strd));
          auVar6 = pmovzxbw(in_XMM2,*(undefined8 *)(pu1_src + lVar3 + src_strd * 2));
          auVar7 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_src + lVar3 + src_strd * 3));
          in_XMM0 = psllw(auVar4,6);
          in_XMM1 = psllw(auVar5,6);
          in_XMM2 = psllw(auVar6,6);
          in_XMM3 = psllw(auVar7,6);
          *(long *)(pi2_dst + lVar3) = in_XMM0._0_8_;
          *(long *)(pi2_dst + dst_strd + lVar3) = in_XMM1._0_8_;
          *(long *)(pi2_dst + dst_strd * 2 + lVar3) = in_XMM2._0_8_;
          *(long *)(pi2_dst + dst_strd * 3 + lVar3) = in_XMM3._0_8_;
          pWVar2 = pWVar2 + 4;
          lVar3 = lVar3 + 4;
        } while ((int)lVar3 < wd);
        pu1_src = pu1_src + lVar3;
        pi2_dst = pWVar2;
      }
      pu1_src = pu1_src + (src_strd * 4 - wd);
      pi2_dst = pi2_dst + (dst_strd * 4 - wd);
      iVar1 = iVar1 + 4;
    } while (iVar1 < ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out_sse42(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    __m128i  src0_16x8b, src1_16x8b, src2_16x8b, src3_16x8b;
    UNUSED(pi1_coeff);
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    if(0 == (wd & 7)) /* multiple of 8 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);
                src2_16x8b = _mm_cvtepu8_epi16(src2_16x8b);
                src3_16x8b = _mm_cvtepu8_epi16(src3_16x8b);

                src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src2_16x8b = _mm_slli_epi16(src2_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src3_16x8b = _mm_slli_epi16(src3_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* storing 16 8-bit output values */
                _mm_storeu_si128((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                _mm_storeu_si128((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storeu_si128((__m128i *)(pi2_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storeu_si128((__m128i *)(pi2_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 8; /* pointer update */
                pi2_dst += 8; /* pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pi2_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                src0_16x8b = _mm_cvtepu8_epi16(src0_16x8b);
                src1_16x8b = _mm_cvtepu8_epi16(src1_16x8b);
                src2_16x8b = _mm_cvtepu8_epi16(src2_16x8b);
                src3_16x8b = _mm_cvtepu8_epi16(src3_16x8b);

                src0_16x8b = _mm_slli_epi16(src0_16x8b,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */
                src1_16x8b = _mm_slli_epi16(src1_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src2_16x8b = _mm_slli_epi16(src2_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);
                src3_16x8b = _mm_slli_epi16(src3_16x8b,  SHIFT_14_MINUS_BIT_DEPTH);

                /* storing 16 8-bit output values */
                _mm_storel_epi64((__m128i *)(pi2_dst), src0_16x8b);                 /* row =0 */
                _mm_storel_epi64((__m128i *)(pi2_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storel_epi64((__m128i *)(pi2_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storel_epi64((__m128i *)(pi2_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 4; /* pointer update */
                pi2_dst += 4; /* pointer update */
            } /* inner for loop ends here(4-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pi2_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
}